

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

Flow * __thiscall
wasm::Visitor<wasm::CExpressionRunner,_wasm::Flow>::visit
          (Flow *__return_storage_ptr__,Visitor<wasm::CExpressionRunner,_wasm::Flow> *this,
          Expression *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar2 = NONCONSTANT_FLOW._8_8_;
  uVar1 = NONCONSTANT_FLOW._0_8_;
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBlock
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Block *)curr);
      break;
    case IfId:
      ExpressionRunner<wasm::CExpressionRunner>::visitIf
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,(If *)curr
                );
      break;
    case LoopId:
      ExpressionRunner<wasm::CExpressionRunner>::visitLoop
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Loop *)curr);
      break;
    case BreakId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBreak
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Break *)curr);
      break;
    case SwitchId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSwitch
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Switch *)curr);
      break;
    case CallId:
    case CallIndirectId:
    case LoadId:
    case StoreId:
    case MemorySizeId:
    case MemoryGrowId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case TryId:
    case TryTableId:
    case RethrowId:
    case CallRefId:
    case ArrayNewDataId:
    case ArrayNewElemId:
    case ArrayCopyId:
    case ArrayFillId:
    case ArrayInitDataId:
    case ArrayInitElemId:
    case ContNewId:
    case ContBindId:
    case SuspendId:
    case ResumeId:
    case ResumeThrowId:
    case StackSwitchId:
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
      break;
    case LocalGetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalGet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (LocalGet *)curr);
      break;
    case LocalSetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalSet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (LocalSet *)curr);
      break;
    case GlobalGetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalGet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (GlobalGet *)curr);
      break;
    case GlobalSetId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalSet
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (GlobalSet *)curr);
      break;
    case ConstId:
      ExpressionRunner<wasm::CExpressionRunner>::visitConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Const *)curr);
      break;
    case UnaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitUnary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Unary *)curr);
      break;
    case BinaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBinary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Binary *)curr);
      break;
    case SelectId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSelect
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Select *)curr);
      break;
    case DropId:
      ExpressionRunner<wasm::CExpressionRunner>::visitDrop
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Drop *)curr);
      break;
    case ReturnId:
      ExpressionRunner<wasm::CExpressionRunner>::visitReturn
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Return *)curr);
      break;
    case NopId:
    case AtomicFenceId:
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      break;
    case UnreachableId:
      ExpressionRunner<wasm::CExpressionRunner>::visitUnreachable
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Unreachable *)curr);
      break;
    case SIMDExtractId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDReplace
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShuffle
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDTernary
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShift
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (SIMDShift *)curr);
      break;
    case RefNullId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefNull *)curr);
      break;
    case RefIsNullId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefIsNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefIsNull *)curr);
      break;
    case RefFuncId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefFunc
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefFunc *)curr);
      break;
    case RefEqId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefEq *)curr);
      break;
    case ThrowId:
      ExpressionRunner<wasm::CExpressionRunner>::visitThrow
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (Throw *)curr);
      break;
    case ThrowRefId:
      ExpressionRunner<wasm::CExpressionRunner>::visitThrowRef
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ThrowRef *)curr);
      break;
    case TupleMakeId:
      ExpressionRunner<wasm::CExpressionRunner>::visitTupleMake
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TupleMake *)curr);
      break;
    case TupleExtractId:
      ExpressionRunner<wasm::CExpressionRunner>::visitTupleExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (TupleExtract *)curr);
      break;
    case RefI31Id:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefI31
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefI31 *)curr);
      break;
    case I31GetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitI31Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (I31Get *)curr);
      break;
    case RefTestId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefTest
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefTest *)curr);
      break;
    case RefCastId:
      ExpressionRunner<wasm::CExpressionRunner>::visitRefCast
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefCast *)curr);
      break;
    case BrOnId:
      ExpressionRunner<wasm::CExpressionRunner>::visitBrOn
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (BrOn *)curr);
      break;
    case StructNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructNew *)curr);
      break;
    case StructGetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructGet *)curr);
      break;
    case StructSetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructSet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructSet *)curr);
      break;
    case StructRMWId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructRMW
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructRMW *)curr);
      break;
    case StructCmpxchgId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStructCmpxchg
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNew *)curr);
      break;
    case ArrayNewFixedId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayNewFixed
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayGet *)curr);
      break;
    case ArraySetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArraySet
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArraySet *)curr);
      break;
    case ArrayLenId:
      ExpressionRunner<wasm::CExpressionRunner>::visitArrayLen
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (ArrayLen *)curr);
      break;
    case RefAsId:
      ConstantExpressionRunner<wasm::CExpressionRunner>::visitRefAs
                (__return_storage_ptr__,(ConstantExpressionRunner<wasm::CExpressionRunner> *)this,
                 (RefAs *)curr);
      break;
    case StringNewId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringNew
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringNew *)curr);
      break;
    case StringConstId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringConst *)curr);
      break;
    case StringMeasureId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringMeasure
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringMeasure *)curr);
      break;
    case StringEncodeId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringEncode
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringEncode *)curr);
      break;
    case StringConcatId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringConcat
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringConcat *)curr);
      break;
    case StringEqId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringEq *)curr);
      break;
    case StringWTF16GetId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringWTF16Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      ExpressionRunner<wasm::CExpressionRunner>::visitStringSliceWTF
                (__return_storage_ptr__,(ExpressionRunner<wasm::CExpressionRunner> *)this,
                 (StringSliceWTF *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::CExpressionRunner, wasm::Flow>::visit(Expression *) [SubType = wasm::CExpressionRunner, ReturnType = wasm::Flow]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }